

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O0

int lejp_parser_pop(lejp_ctx *ctx)

{
  lejp_ctx *ctx_local;
  
  if (ctx->pst_sp == '\0') {
    ctx_local._4_4_ = -1;
  }
  else {
    ctx->pst_sp = ctx->pst_sp + 0xff;
    _lws_log(0x10,"%s: popped parser stack to %d\n","lejp_parser_pop",(ulong)ctx->pst_sp);
    ctx->path_match = '\0';
    lejp_check_path_match(ctx);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int
lejp_parser_pop(struct lejp_ctx *ctx)
{
	if (!ctx->pst_sp)
		return -1;

	ctx->pst_sp--;
	lwsl_debug("%s: popped parser stack to %d\n", __func__, ctx->pst_sp);

	ctx->path_match = 0; /* force it to check */
	lejp_check_path_match(ctx);

	return 0;
}